

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O0

statemachine_definition * statemachine_definition_new(int states)

{
  state_event_function *pp_Var1;
  statemachine_definition *def;
  statemachine_definition *psStack_10;
  int states_local;
  
  psStack_10 = (statemachine_definition *)malloc(0x30);
  if (psStack_10 == (statemachine_definition *)0x0) {
    psStack_10 = (statemachine_definition *)0x0;
  }
  else {
    pp_Var1 = (state_event_function *)calloc((long)states,8);
    psStack_10->in_state_events = pp_Var1;
    if (psStack_10->in_state_events == (state_event_function *)0x0) {
      psStack_10 = (statemachine_definition *)0x0;
    }
    else {
      pp_Var1 = (state_event_function *)calloc((long)states,8);
      psStack_10->enter_state_events = pp_Var1;
      if (psStack_10->enter_state_events == (state_event_function *)0x0) {
        psStack_10 = (statemachine_definition *)0x0;
      }
      else {
        pp_Var1 = (state_event_function *)calloc((long)states,8);
        psStack_10->exit_state_events = pp_Var1;
        if (psStack_10->exit_state_events == (state_event_function *)0x0) {
          psStack_10 = (statemachine_definition *)0x0;
        }
        else {
          psStack_10->num_states = states;
          psStack_10->state_names = (char **)0x0;
        }
      }
    }
  }
  return psStack_10;
}

Assistant:

statemachine_definition *statemachine_definition_new(int states)
{
    statemachine_definition *def;
    def = CAST(statemachine_definition *,
               malloc(sizeof(statemachine_definition)));
    if (def == NULL)
      return NULL;

    def->in_state_events = CAST(state_event_function *,
                                calloc(states, sizeof(state_event_function)));
    if (def->in_state_events == NULL)
      return NULL;

    def->enter_state_events =CAST(state_event_function *,
                                   calloc(states,
                                          sizeof(state_event_function)));
    if (def->enter_state_events == NULL)
      return NULL;

    def->exit_state_events = CAST(state_event_function *,
                                  calloc(states, sizeof(state_event_function)));
    if (def->exit_state_events == NULL)
      return NULL;

    def->num_states = states;
    def->state_names = NULL;
    return def;
}